

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.hpp
# Opt level: O2

char * __thiscall deqp::LineStream::str(LineStream *this)

{
  string local_30 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_string,local_30);
  std::__cxx11::string::~string(local_30);
  return (this->m_string)._M_dataplus._M_p;
}

Assistant:

const char* str(void) const
	{
		m_string = m_stream.str();
		return m_string.c_str();
	}